

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test_driver.h
# Opt level: O0

void __thiscall libaom_test::Encoder::Control(Encoder *this,int ctrl_id,int arg)

{
  bool bVar1;
  AssertHelper *message;
  AssertHelper *this_00;
  uint in_EDX;
  uint in_ESI;
  Message *in_RDI;
  AssertHelper *unaff_retaddr;
  AssertionResult gtest_ar;
  aom_codec_err_t res;
  char **in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff80;
  aom_codec_err_t *in_stack_ffffffffffffff88;
  Encoder *in_stack_ffffffffffffff90;
  int line;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Type in_stack_ffffffffffffffac;
  Message *in_stack_ffffffffffffffb0;
  AssertHelper *this_01;
  AssertionResult local_28;
  aom_codec_err_t local_14;
  Message *message_00;
  
  message_00 = in_RDI;
  local_14 = aom_codec_control((aom_codec_ctx_t *)(in_RDI + 1),(int)(ulong)in_ESI,(ulong)in_EDX);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (aom_codec_err_t *)in_stack_ffffffffffffff80);
  line = (int)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(in_stack_ffffffffffffffb0);
    message = (AssertHelper *)EncoderError(in_stack_ffffffffffffff90);
    this_01 = message;
    testing::Message::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x3c8e41)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffffac,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),line,
               (char *)message);
    testing::internal::AssertHelper::operator=(unaff_retaddr,message_00);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x3c8e8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8eef);
  return;
}

Assistant:

void Control(int ctrl_id, int arg) {
    const aom_codec_err_t res = aom_codec_control(&encoder_, ctrl_id, arg);
    ASSERT_EQ(AOM_CODEC_OK, res) << EncoderError();
  }